

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O2

void __thiscall
vkt::compute::anon_unknown_0::CopySSBOToImageTest::initPrograms
          (CopySSBOToImageTest *this,SourceCollections *sourceCollections)

{
  ostream *poVar1;
  ProgramSources *this_00;
  ostringstream src;
  allocator<char> local_1f9;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [40];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"#version 310 es\n");
  poVar1 = std::operator<<(poVar1,"layout (local_size_x = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[0]);
  poVar1 = std::operator<<(poVar1,", local_size_y = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->m_localSize).m_data[1]);
  poVar1 = std::operator<<(poVar1,") in;\n");
  poVar1 = std::operator<<(poVar1,
                           "layout(binding = 1, r32ui) writeonly uniform highp uimage2D u_dstImg;\n"
                          );
  poVar1 = std::operator<<(poVar1,"layout(binding = 0) readonly buffer Input {\n");
  poVar1 = std::operator<<(poVar1,"    uint values[");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,(this->m_imageSize).m_data[1] * (this->m_imageSize).m_data[0]);
  poVar1 = std::operator<<(poVar1,"];\n");
  poVar1 = std::operator<<(poVar1,"} sb_in;\n\n");
  poVar1 = std::operator<<(poVar1,"void main (void) {\n");
  poVar1 = std::operator<<(poVar1,"    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n");
  poVar1 = std::operator<<(poVar1,
                           "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "    imageStore(u_dstImg, ivec2(gl_GlobalInvocationID.xy), uvec4(value, 0, 0, 0));\n"
                          );
  std::operator<<(poVar1,"}\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"comp",&local_1f9);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&sourceCollections->glslSources,&local_1d8);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)local_1b8,&local_1f8);
  glu::ProgramSources::operator<<(this_00,(ShaderSource *)local_1b8);
  std::__cxx11::string::~string((string *)(local_1b8 + 8));
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void CopySSBOToImageTest::initPrograms (SourceCollections& sourceCollections) const
{
	std::ostringstream src;
	src << "#version 310 es\n"
		<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ") in;\n"
		<< "layout(binding = 1, r32ui) writeonly uniform highp uimage2D u_dstImg;\n"
		<< "layout(binding = 0) readonly buffer Input {\n"
		<< "    uint values[" << (m_imageSize.x() * m_imageSize.y()) << "];\n"
		<< "} sb_in;\n\n"
		<< "void main (void) {\n"
		<< "    uint stride = gl_NumWorkGroups.x*gl_WorkGroupSize.x;\n"
		<< "    uint value  = sb_in.values[gl_GlobalInvocationID.y*stride + gl_GlobalInvocationID.x];\n"
		<< "    imageStore(u_dstImg, ivec2(gl_GlobalInvocationID.xy), uvec4(value, 0, 0, 0));\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}